

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern.c
# Opt level: O0

xmlPatParserContextPtr xmlNewPatParserContext(xmlChar *pattern,xmlDictPtr dict,xmlChar **namespaces)

{
  int local_34;
  int i;
  xmlPatParserContextPtr cur;
  xmlChar **namespaces_local;
  xmlDictPtr dict_local;
  xmlChar *pattern_local;
  
  if (pattern == (xmlChar *)0x0) {
    pattern_local = (xmlChar *)0x0;
  }
  else {
    pattern_local = (xmlChar *)(*xmlMalloc)(0x40);
    if (pattern_local == (xmlChar *)0x0) {
      pattern_local = (xmlChar *)0x0;
    }
    else {
      memset(pattern_local,0,0x40);
      *(xmlDictPtr *)(pattern_local + 0x18) = dict;
      *(xmlChar **)pattern_local = pattern;
      *(xmlChar **)(pattern_local + 8) = pattern;
      if (namespaces == (xmlChar **)0x0) {
        pattern_local[0x38] = '\0';
        pattern_local[0x39] = '\0';
        pattern_local[0x3a] = '\0';
        pattern_local[0x3b] = '\0';
      }
      else {
        local_34 = 0;
        while (namespaces[local_34 << 1] != (xmlChar *)0x0) {
          local_34 = local_34 + 1;
        }
        *(int *)(pattern_local + 0x38) = local_34;
      }
      *(xmlChar ***)(pattern_local + 0x30) = namespaces;
    }
  }
  return (xmlPatParserContextPtr)pattern_local;
}

Assistant:

static xmlPatParserContextPtr
xmlNewPatParserContext(const xmlChar *pattern, xmlDictPtr dict,
                       const xmlChar **namespaces) {
    xmlPatParserContextPtr cur;

    if (pattern == NULL)
        return(NULL);

    cur = (xmlPatParserContextPtr) xmlMalloc(sizeof(xmlPatParserContext));
    if (cur == NULL) {
	ERROR(NULL, NULL, NULL,
		"xmlNewPatParserContext : malloc failed\n");
	return(NULL);
    }
    memset(cur, 0, sizeof(xmlPatParserContext));
    cur->dict = dict;
    cur->cur = pattern;
    cur->base = pattern;
    if (namespaces != NULL) {
        int i;
        for (i = 0;namespaces[2 * i] != NULL;i++)
            ;
        cur->nb_namespaces = i;
    } else {
        cur->nb_namespaces = 0;
    }
    cur->namespaces = namespaces;
    return(cur);
}